

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP3Writer::AggregateWriteData(BP3Writer *this,bool isFinal,int transportIndex)

{
  BPBase *this_00;
  ExchangeRequests *__return_storage_ptr__;
  BP3Serializer *this_01;
  TransportMan *this_02;
  int iVar1;
  Buffer *pBVar2;
  undefined4 extraout_var;
  _func_int *p_Var3;
  BufferSTL *bufferSTL;
  int iVar4;
  ScopedTimer __var2389;
  ExchangeAbsolutePositionRequests absolutePositionRequests;
  ExchangeRequests dataRequests;
  ScopedTimer local_60;
  undefined1 local_58 [40];
  
  if (AggregateWriteData(bool,int)::__var389 == '\0') {
    iVar4 = __cxa_guard_acquire(&AggregateWriteData(bool,int)::__var389);
    if (iVar4 != 0) {
      AggregateWriteData::__var389 = (void *)ps_timer_create_("BP3Writer::AggregateWriteData");
      __cxa_guard_release(&AggregateWriteData(bool,int)::__var389);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&local_60,AggregateWriteData::__var389);
  this_01 = &this->m_BP3Serializer;
  adios2::format::BP3Serializer::CloseStream(this_01,(this->super_Engine).m_IO,false);
  this_02 = &this->m_FileDataManager;
  __return_storage_ptr__ = (ExchangeRequests *)(local_58 + 0x10);
  for (iVar4 = 0; p_Var3 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3],
      iVar4 < *(int *)(p_Var3 + 0x324 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base);
      iVar4 = iVar4 + 1) {
    aggregator::MPIChain::IExchange
              (__return_storage_ptr__,
               (MPIChain *)(&(this_01->super_BP3Base).field_0x2f8 + (long)p_Var3),
               (Buffer *)
               (p_Var3 + 0x30 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),iVar4);
    p_Var3 = (this_01->super_BP3Base)._vptr_BP3Base[-3];
    aggregator::MPIChain::IExchangeAbsolutePosition
              ((MPIChain *)local_58,(Buffer *)(&(this_01->super_BP3Base).field_0x2f8 + (long)p_Var3)
               ,(int)this + 0xf0 + (int)p_Var3);
    p_Var3 = (this_01->super_BP3Base)._vptr_BP3Base[-3];
    if ((p_Var3 + 0x328)[(long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base] ==
        (_func_int)0x1) {
      pBVar2 = aggregator::MPIChain::GetConsumerBuffer
                         ((MPIChain *)(&(this_01->super_BP3Base).field_0x2f8 + (long)p_Var3),
                          (Buffer *)(&(this_01->super_BP3Base).field_0x30 + (long)p_Var3));
      iVar1 = (*pBVar2->_vptr_Buffer[3])(pBVar2);
      transportman::TransportMan::WriteFiles
                (this_02,(char *)CONCAT44(extraout_var,iVar1),pBVar2->m_Position,transportIndex);
      transportman::TransportMan::FlushFiles(this_02,transportIndex);
      p_Var3 = (this_01->super_BP3Base)._vptr_BP3Base[-3];
    }
    aggregator::MPIChain::WaitAbsolutePosition
              ((MPIChain *)
               (p_Var3 + 0x2f8 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),
               (ExchangeAbsolutePositionRequests *)local_58,iVar4);
    aggregator::MPIChain::Wait
              ((MPIChain *)
               ((this_01->super_BP3Base)._vptr_BP3Base[-3] + 0x2f8 +
               (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),__return_storage_ptr__,
               iVar4);
    aggregator::MPIChain::SwapBuffers
              ((MPIChain *)
               ((this_01->super_BP3Base)._vptr_BP3Base[-3] + 0x2f8 +
               (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),iVar4);
    aggregator::MPIChain::ExchangeAbsolutePositionRequests::~ExchangeAbsolutePositionRequests
              ((ExchangeAbsolutePositionRequests *)local_58);
    aggregator::MPIChain::ExchangeRequests::~ExchangeRequests(__return_storage_ptr__);
  }
  adios2::format::BPSerializer::UpdateOffsetsInMetadata
            ((BPSerializer *)&(this->m_BP3Serializer).super_BP3Base.field_0x8);
  if (isFinal) {
    p_Var3 = (this_01->super_BP3Base)._vptr_BP3Base[-3];
    this_00 = (BPBase *)((long)&(this_01->super_BP3Base)._vptr_BP3Base + (long)p_Var3);
    bufferSTL = (BufferSTL *)(&(this_01->super_BP3Base).field_0x30 + (long)p_Var3);
    adios2::format::BPBase::ResetBuffer(this_00,(Buffer *)bufferSTL,false,false);
    adios2::format::BP3Serializer::AggregateCollectiveMetadata
              (this_01,(Comm *)(&(this_01->super_BP3Base).field_0x318 +
                               (long)(this_01->super_BP3Base)._vptr_BP3Base[-3]),bufferSTL,false);
    p_Var3 = (this_01->super_BP3Base)._vptr_BP3Base[-3];
    if ((p_Var3 + 0x328)[(long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base] ==
        (_func_int)0x1) {
      transportman::TransportMan::WriteFiles
                (this_02,(this_00->m_Data).m_Buffer.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                 (this_00->m_Data).super_Buffer.m_Position,transportIndex);
      transportman::TransportMan::FlushFiles(this_02,transportIndex);
      p_Var3 = (this_01->super_BP3Base)._vptr_BP3Base[-3];
    }
    aggregator::MPIChain::Close((MPIChain *)(&(this_01->super_BP3Base).field_0x2f8 + (long)p_Var3));
  }
  aggregator::MPIChain::ResetBuffers
            ((MPIChain *)
             (&(this_01->super_BP3Base).field_0x2f8 +
             (long)(this_01->super_BP3Base)._vptr_BP3Base[-3]));
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_60);
  return;
}

Assistant:

void BP3Writer::AggregateWriteData(const bool isFinal, const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::AggregateWriteData");
    m_BP3Serializer.CloseStream(m_IO, false);

    // async?
    for (int r = 0; r < m_BP3Serializer.m_Aggregator.m_Size; ++r)
    {
        aggregator::MPIChain::ExchangeRequests dataRequests =
            m_BP3Serializer.m_Aggregator.IExchange(m_BP3Serializer.m_Data, r);

        aggregator::MPIChain::ExchangeAbsolutePositionRequests absolutePositionRequests =
            m_BP3Serializer.m_Aggregator.IExchangeAbsolutePosition(m_BP3Serializer.m_Data, r);

        if (m_BP3Serializer.m_Aggregator.m_IsAggregator)
        {
            const format::Buffer &bufferSTL =
                m_BP3Serializer.m_Aggregator.GetConsumerBuffer(m_BP3Serializer.m_Data);

            m_FileDataManager.WriteFiles(bufferSTL.Data(), bufferSTL.m_Position, transportIndex);

            m_FileDataManager.FlushFiles(transportIndex);
        }

        m_BP3Serializer.m_Aggregator.WaitAbsolutePosition(absolutePositionRequests, r);

        m_BP3Serializer.m_Aggregator.Wait(dataRequests, r);
        m_BP3Serializer.m_Aggregator.SwapBuffers(r);
    }

    m_BP3Serializer.UpdateOffsetsInMetadata();

    if (isFinal) // Write metadata footer
    {
        format::BufferSTL &bufferSTL = m_BP3Serializer.m_Data;
        m_BP3Serializer.ResetBuffer(bufferSTL, false, false);

        m_BP3Serializer.AggregateCollectiveMetadata(m_BP3Serializer.m_Aggregator.m_Comm, bufferSTL,
                                                    false);

        if (m_BP3Serializer.m_Aggregator.m_IsAggregator)
        {
            m_FileDataManager.WriteFiles(bufferSTL.m_Buffer.data(), bufferSTL.m_Position,
                                         transportIndex);

            m_FileDataManager.FlushFiles(transportIndex);
        }

        m_BP3Serializer.m_Aggregator.Close();
    }

    m_BP3Serializer.m_Aggregator.ResetBuffers();
}